

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O3

void __thiscall
absl::Flag<bool>::Flag(Flag<bool> *this,char *name,char *type,char *help,bool *default_value)

{
  Flag<bool> *pFVar1;
  element_type *peVar2;
  FlagFunc *__p;
  char *pcVar3;
  allocator<char> local_61;
  undefined1 local_60 [32];
  shared_ptr<absl::internal::FlagFunc> local_40;
  
  this->_vptr_Flag = (_func_int **)&PTR__Flag_0037c638;
  this->value_ = *default_value;
  __p = (FlagFunc *)operator_new(0x58);
  (__p->default_value)._M_dataplus._M_p = (pointer)&(__p->default_value).field_2;
  (__p->default_value)._M_string_length = 0;
  (__p->default_value).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(__p->set_value).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__p->set_value).super__Function_base._M_functor + 8) = 0;
  (__p->set_value).super__Function_base._M_manager = (_Manager_type)0x0;
  (__p->set_value)._M_invoker = (_Invoker_type)0x0;
  (this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<absl::internal::FlagFunc*>
            (&(this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  peVar2 = (this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2->name = name;
  peVar2->help = help;
  peVar2->type = type;
  pcVar3 = "false";
  if ((ulong)*default_value != 0) {
    pcVar3 = "true";
  }
  pFVar1 = (Flag<bool> *)(local_60 + 0x10);
  local_60._0_8_ = pFVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,pcVar3,pcVar3 + ((ulong)*default_value ^ 5));
  std::__cxx11::string::operator=
            ((string *)
             &((this->func_).
               super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              default_value,(string *)local_60);
  if ((Flag<bool> *)local_60._0_8_ != pFVar1) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  local_60._0_8_ = this;
  std::function<void(std::__cxx11::string_const&)>::operator=
            ((function<void(std::__cxx11::string_const&)> *)
             &((this->func_).
               super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              set_value,(anon_class_8_1_8991fb9c *)local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,name,&local_61);
  local_40.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_40.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_40.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_40.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_40.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  internal::RegisterFlag((string *)local_60,&local_40);
  if (local_40.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((Flag<bool> *)local_60._0_8_ != pFVar1) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  return;
}

Assistant:

Flag<T>::Flag(const char *name, const char *type, const char *help,
              const T &default_value)
    : value_(default_value), func_(new internal::FlagFunc) {
  func_->name = name;
  func_->help = help;
  func_->type = type;
  func_->default_value = internal::to_str<T>(default_value);
  func_->set_value = [this](const std::string &value) {
    this->set_value_as_str(value);
  };
  RegisterFlag(name, func_);
}